

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O3

void __thiscall PDFHummus::DocumentContext::~DocumentContext(DocumentContext *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  Cleanup(this);
  std::
  _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->mExtGStateRegistry).mAlphaExtGstates._M_t);
  EncryptionHelper::~EncryptionHelper(&this->mEncryptionHelper);
  std::
  _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_PDFHummus::HummusImageInformation>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_PDFHummus::HummusImageInformation>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_PDFHummus::HummusImageInformation>_>_>
  ::~_Rb_tree(&(this->mImagesInformation)._M_t);
  std::
  _Rb_tree<PDFTiledPattern_*,_std::pair<PDFTiledPattern_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>,_std::_Select1st<std::pair<PDFTiledPattern_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>,_std::less<PDFTiledPattern_*>,_std::allocator<std::pair<PDFTiledPattern_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>_>
  ::~_Rb_tree(&(this->mMoreTiledPatternEndTasks)._M_t);
  std::
  _Rb_tree<PDFPage_*,_std::pair<PDFPage_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>,_std::_Select1st<std::pair<PDFPage_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>,_std::less<PDFPage_*>,_std::allocator<std::pair<PDFPage_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>_>
  ::~_Rb_tree(&(this->mMorePageEndTasks)._M_t);
  std::
  _Rb_tree<PDFFormXObject_*,_std::pair<PDFFormXObject_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>,_std::_Select1st<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>,_std::less<PDFFormXObject_*>,_std::allocator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>_>
  ::~_Rb_tree(&(this->mMoreFormEndTasks)._M_t);
  std::
  _Rb_tree<PDFTiledPattern_*,_std::pair<PDFTiledPattern_*const,_std::__cxx11::list<ITiledPatternEndWritingTask_*,_std::allocator<ITiledPatternEndWritingTask_*>_>_>,_std::_Select1st<std::pair<PDFTiledPattern_*const,_std::__cxx11::list<ITiledPatternEndWritingTask_*,_std::allocator<ITiledPatternEndWritingTask_*>_>_>_>,_std::less<PDFTiledPattern_*>,_std::allocator<std::pair<PDFTiledPattern_*const,_std::__cxx11::list<ITiledPatternEndWritingTask_*,_std::allocator<ITiledPatternEndWritingTask_*>_>_>_>_>
  ::~_Rb_tree(&(this->mTiledPatternEndTasks)._M_t);
  std::
  _Rb_tree<PDFPage_*,_std::pair<PDFPage_*const,_std::__cxx11::list<IPageEndWritingTask_*,_std::allocator<IPageEndWritingTask_*>_>_>,_std::_Select1st<std::pair<PDFPage_*const,_std::__cxx11::list<IPageEndWritingTask_*,_std::allocator<IPageEndWritingTask_*>_>_>_>,_std::less<PDFPage_*>,_std::allocator<std::pair<PDFPage_*const,_std::__cxx11::list<IPageEndWritingTask_*,_std::allocator<IPageEndWritingTask_*>_>_>_>_>
  ::~_Rb_tree(&(this->mPageEndTasks)._M_t);
  std::
  _Rb_tree<PDFFormXObject_*,_std::pair<PDFFormXObject_*const,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>_>,_std::_Select1st<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>_>_>,_std::less<PDFFormXObject_*>,_std::allocator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>_>_>_>
  ::~_Rb_tree(&(this->mFormEndTasks)._M_t);
  std::
  _Rb_tree<std::pair<ResourcesDictionary_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<ResourcesDictionary_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::list<IResourceWritingTask_*,_std::allocator<IResourceWritingTask_*>_>_>,_std::_Select1st<std::pair<const_std::pair<ResourcesDictionary_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::list<IResourceWritingTask_*,_std::allocator<IResourceWritingTask_*>_>_>_>,_std::less<std::pair<ResourcesDictionary_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<ResourcesDictionary_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::list<IResourceWritingTask_*,_std::allocator<IResourceWritingTask_*>_>_>_>_>
  ::~_Rb_tree(&(this->mResourcesTasks)._M_t);
  pcVar2 = (this->mNewPDFID)._M_dataplus._M_p;
  paVar1 = &(this->mNewPDFID).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->mModifiedDocumentID)._M_dataplus._M_p;
  paVar1 = &(this->mModifiedDocumentID).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<PDFDocumentCopyingContext_*,_PDFDocumentCopyingContext_*,_std::_Identity<PDFDocumentCopyingContext_*>,_std::less<PDFDocumentCopyingContext_*>,_std::allocator<PDFDocumentCopyingContext_*>_>
  ::~_Rb_tree(&(this->mCopyingContexts)._M_t);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&(this->mAnnotations)._M_t);
  UsedFontsRepository::~UsedFontsRepository(&this->mUsedFontsRepository);
  PDFDocumentHandler::~PDFDocumentHandler(&this->mPDFDocumentHandler);
  PNGImageHandler::~PNGImageHandler(&this->mPNGImageHandler);
  TIFFImageHandler::~TIFFImageHandler(&this->mTIFFImageHandler);
  JPEGImageHandler::~JPEGImageHandler(&this->mJPEGImageHandler);
  std::
  _Rb_tree<IDocumentContextExtender_*,_IDocumentContextExtender_*,_std::_Identity<IDocumentContextExtender_*>,_std::less<IDocumentContextExtender_*>,_std::allocator<IDocumentContextExtender_*>_>
  ::~_Rb_tree(&(this->mExtenders)._M_t);
  pcVar2 = (this->mOutputFilePath)._M_dataplus._M_p;
  paVar1 = &(this->mOutputFilePath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  CatalogInformation::~CatalogInformation(&this->mCatalogInformation);
  TrailerInformation::~TrailerInformation(&this->mTrailerInformation);
  return;
}

Assistant:

DocumentContext::~DocumentContext(void)
{
    Cleanup();
}